

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int convertCompoundSelectToSubquery(Walker *pWalker,Select *p)

{
  long lVar1;
  Token *pTable;
  void *__dest;
  SrcList *pSVar2;
  ExprList *pEVar3;
  Parse *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  Parse *pParse;
  SrcList *pNewSrc;
  ExprList_item *a;
  sqlite3 *db;
  Select *pX;
  Select *pNew;
  int i;
  Token dummy;
  u64 in_stack_ffffffffffffff78;
  Expr *pExpr;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  SrcList *in_stack_ffffffffffffff88;
  sqlite3 *db_00;
  undefined6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 uVar4;
  Token *pDatabase;
  sqlite3_vfs *p_00;
  Parse *pParse_00;
  int local_34;
  int local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pDatabase = (Token *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_RSI->aLabel == (int *)0x0) {
    local_1c = 0;
  }
  else {
    lVar1._0_4_ = in_RSI->nLabel;
    lVar1._4_4_ = in_RSI->nLabelAlloc;
    pParse_00 = in_RSI;
    if (lVar1 == 0) {
      local_1c = 0;
    }
    else {
      while( true ) {
        uVar4 = false;
        if ((pParse_00 != (Parse *)0x0) &&
           (in_stack_ffffffffffffff96 = true, uVar4 = in_stack_ffffffffffffff96,
           *(char *)&pParse_00->db != -0x78)) {
          in_stack_ffffffffffffff96 = *(char *)&pParse_00->db == -0x75;
          uVar4 = in_stack_ffffffffffffff96;
        }
        if ((bool)uVar4 == false) break;
        pParse_00 = (Parse *)pParse_00->aLabel;
      }
      if (pParse_00 == (Parse *)0x0) {
        local_1c = 0;
      }
      else {
        pTable = (Token *)(*(long *)&in_RSI->nLabel + 8);
        if (*(short *)(*(long *)&in_RSI->nLabel + 0x1c) == 0) {
          local_34 = **(int **)&in_RSI->nLabel;
          do {
            local_34 = local_34 + -1;
            if (local_34 < 0) break;
          } while ((*(uint *)(*(long *)((long)pTable + (long)local_34 * 0x18) + 4) & 0x200) == 0);
          if (local_34 < 0) {
            local_1c = 0;
          }
          else {
            db_00 = (sqlite3 *)*in_RDI;
            p_00 = db_00->pVfs;
            __dest = sqlite3DbMallocZero((sqlite3 *)
                                         CONCAT44(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),
                                         in_stack_ffffffffffffff78);
            if (__dest == (void *)0x0) {
              local_1c = 2;
            }
            else {
              memset(&local_18,0,0x10);
              pExpr = (Expr *)0x0;
              pSVar2 = sqlite3SrcListAppendFromTerm
                                 (pParse_00,(SrcList *)p_00,pTable,pDatabase,(Token *)db_00,
                                  (Select *)
                                  CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff96,
                                                          in_stack_ffffffffffffff90)),
                                  (OnOrUsing *)in_RSI);
              if (*(int *)((long)&db_00->flags + 4) == 0) {
                memcpy(__dest,in_RSI,0x80);
                *(SrcList **)&in_RSI->mSubrtnSig = pSVar2;
                sqlite3Expr(db_00,in_stack_ffffffffffffff84,(char *)pExpr);
                pEVar3 = sqlite3ExprListAppend
                                   ((Parse *)db_00,
                                    (ExprList *)
                                    CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                    pExpr);
                *(ExprList **)&in_RSI->isMultiWrite = pEVar3;
                *(undefined1 *)&in_RSI->db = 0x8b;
                in_RSI->iRangeReg = 0;
                in_RSI->nErr = 0;
                *(undefined8 *)((long)__dest + 0x38) = 0;
                *(undefined8 *)((long)__dest + 0x40) = 0;
                *(undefined8 *)((long)__dest + 0x48) = 0;
                in_RSI->aLabel = (int *)0x0;
                in_RSI->pConstExpr = (ExprList *)0x0;
                in_RSI->pIdxPartExpr = (IndexedExpr *)0x0;
                *(undefined8 *)&(in_RSI->constraintName).n = 0;
                *(uint *)((long)&in_RSI->db + 4) = *(uint *)((long)&in_RSI->db + 4) & 0xfffffeff;
                *(uint *)((long)&in_RSI->db + 4) = *(uint *)((long)&in_RSI->db + 4) | 0x10000;
                *(void **)(*(long *)((long)__dest + 0x50) + 0x58) = __dest;
                *(undefined8 *)((long)__dest + 0x60) = 0;
                local_1c = 0;
              }
              else {
                sqlite3SrcListDelete
                          ((sqlite3 *)
                           CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff96,
                                                   in_stack_ffffffffffffff90)),
                           in_stack_ffffffffffffff88);
                local_1c = 2;
              }
            }
          }
        }
        else {
          local_1c = 0;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

static int convertCompoundSelectToSubquery(Walker *pWalker, Select *p){
  int i;
  Select *pNew;
  Select *pX;
  sqlite3 *db;
  struct ExprList_item *a;
  SrcList *pNewSrc;
  Parse *pParse;
  Token dummy;

  if( p->pPrior==0 ) return WRC_Continue;
  if( p->pOrderBy==0 ) return WRC_Continue;
  for(pX=p; pX && (pX->op==TK_ALL || pX->op==TK_SELECT); pX=pX->pPrior){}
  if( pX==0 ) return WRC_Continue;
  a = p->pOrderBy->a;
#ifndef SQLITE_OMIT_WINDOWFUNC
  /* If iOrderByCol is already non-zero, then it has already been matched
  ** to a result column of the SELECT statement. This occurs when the
  ** SELECT is rewritten for window-functions processing and then passed
  ** to sqlite3SelectPrep() and similar a second time. The rewriting done
  ** by this function is not required in this case. */
  if( a[0].u.x.iOrderByCol ) return WRC_Continue;
#endif
  for(i=p->pOrderBy->nExpr-1; i>=0; i--){
    if( a[i].pExpr->flags & EP_Collate ) break;
  }
  if( i<0 ) return WRC_Continue;

  /* If we reach this point, that means the transformation is required. */

  pParse = pWalker->pParse;
  db = pParse->db;
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew) );
  if( pNew==0 ) return WRC_Abort;
  memset(&dummy, 0, sizeof(dummy));
  pNewSrc = sqlite3SrcListAppendFromTerm(pParse,0,0,0,&dummy,pNew,0);
  assert( pNewSrc!=0 || pParse->nErr );
  if( pParse->nErr ){
    sqlite3SrcListDelete(db, pNewSrc);
    return WRC_Abort;
  }
  *pNew = *p;
  p->pSrc = pNewSrc;
  p->pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ASTERISK, 0));
  p->op = TK_SELECT;
  p->pWhere = 0;
  pNew->pGroupBy = 0;
  pNew->pHaving = 0;
  pNew->pOrderBy = 0;
  p->pPrior = 0;
  p->pNext = 0;
  p->pWith = 0;
#ifndef SQLITE_OMIT_WINDOWFUNC
  p->pWinDefn = 0;
#endif
  p->selFlags &= ~SF_Compound;
  assert( (p->selFlags & SF_Converted)==0 );
  p->selFlags |= SF_Converted;
  assert( pNew->pPrior!=0 );
  pNew->pPrior->pNext = pNew;
  pNew->pLimit = 0;
  return WRC_Continue;
}